

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpi_dec_test.c
# Opt level: O3

void * thread_decode(void *arg)

{
  uint uVar1;
  long lVar2;
  MppFrame pvVar3;
  undefined1 auVar4 [16];
  long lVar5;
  long *plVar6;
  FrmCrc *pFVar7;
  MPP_RET MVar8;
  RK_U32 size;
  int iVar9;
  undefined8 uVar10;
  MppBufferGroup pvVar11;
  long lVar12;
  undefined8 uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char *pcVar17;
  int iVar18;
  int iVar19;
  bool bVar20;
  float fVar21;
  MppFrame frame;
  FileBufSlot *slot;
  char log_buf [256];
  MppFrame in_stack_fffffffffffffe38;
  undefined4 uVar22;
  MppFrame local_1a8;
  byte local_199;
  long *local_198;
  FileBufSlot *local_190;
  uint local_188;
  uint local_184;
  FileBufSlot *local_180;
  int local_178;
  undefined4 local_174;
  uint local_170;
  int local_16c;
  long local_168;
  long local_160;
  undefined4 local_158;
  undefined4 local_154;
  long local_150;
  FrmCrc *local_148;
  MppFrame local_140;
  FileBufSlot *local_138 [33];
  
  lVar15 = *arg;
  uVar13 = *(undefined8 *)((long)arg + 8);
  lVar2 = *(long *)((long)arg + 0x10);
  local_148 = (FrmCrc *)((long)arg + 0x88);
  *(undefined8 *)((long)arg + 0x88) = 0;
  *(undefined8 *)((long)arg + 0x90) = 0;
  *(undefined8 *)((long)arg + 0x98) = 0;
  *(undefined8 *)((long)arg + 0xa0) = 0;
  *(undefined8 *)((long)arg + 0xa8) = 0;
  *(undefined8 *)((long)arg + 0xb0) = 0;
  uVar10 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0x90) = uVar10;
  uVar10 = mpp_osal_malloc("thread_decode",0x1000);
  *(undefined8 *)((long)arg + 0xa8) = uVar10;
  local_150 = mpp_time();
  uVar22 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
  local_198 = (long *)arg;
  if (*(int *)(lVar15 + 0x218) == 0) {
    uVar1 = *(uint *)(lVar15 + 0x204);
    if (((uVar1 & 0xf0000) == 0 && (uVar1 & 0xfffc) < 0x14) ||
       ((uVar1 & 0x1fff0) < 0x10010 && (uVar1 & 0xf0000) == 0x10000)) {
      iVar19 = (**(code **)(lVar2 + 0x70))(uVar13,0x31000a,(undefined4 *)(lVar15 + 0x204));
      if (iVar19 != 0) {
        _mpp_log_l(2,"mpi_dec_test","Failed to set output format 0x%x\n",0,
                   *(undefined4 *)(lVar15 + 0x204));
        return (void *)0x0;
      }
    }
    uVar22 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
    iVar19 = *(int *)((long)local_198 + 0x1c);
    arg = local_198;
    while (iVar19 == 0) {
      lVar15 = *arg;
      lVar2 = *(long *)((long)arg + 8);
      lVar12 = *(long *)((long)arg + 0x10);
      local_138[0] = (FileBufSlot *)0x0;
      local_190 = (FileBufSlot *)0x0;
      pvVar3 = *(MppFrame *)((long)arg + 0x38);
      local_1a8 = (MppFrame)0x0;
      lVar5 = *(long *)((long)arg + 0x18);
      local_180 = (FileBufSlot *)0x0;
      MVar8 = reader_index_read(*(FileReader *)(lVar15 + 0x240),0,&local_180);
      if (MVar8 != MPP_OK) {
        in_stack_fffffffffffffe38 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),0x115);
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK",
                   "dec_advanced",in_stack_fffffffffffffe38);
        if ((DAT_001142fb & 0x10) != 0) goto LAB_00105420;
      }
      if (local_180 == (FileBufSlot *)0x0) {
        in_stack_fffffffffffffe38 =
             (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),0x116);
        _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"slot","dec_advanced",
                   in_stack_fffffffffffffe38);
        if ((DAT_001142fb & 0x10) != 0) goto LAB_00105420;
      }
      mpp_packet_init_with_buffer(local_138,local_180->buf);
      if (local_180->eos != 0) {
        mpp_packet_set_eos(local_138[0]);
      }
      lVar16 = mpp_packet_get_meta(local_138[0]);
      if (lVar16 != 0) {
        mpp_meta_set_frame(lVar16,0x6f66726d,pvVar3);
      }
      iVar19 = (**(code **)(lVar12 + 0x10))(lVar2,local_138[0]);
      if (iVar19 == 0) {
        if (local_198[10] == 0) {
          lVar16 = mpp_time();
          local_198[10] = lVar16;
        }
        iVar19 = (**(code **)(lVar12 + 0x18))(lVar2,&local_1a8);
        arg = local_198;
        if (iVar19 != 0 || local_1a8 == (MppFrame)0x0) {
          pcVar17 = "%p mpp decode get frame failed ret %d frame %p\n";
          in_stack_fffffffffffffe38 = local_1a8;
          goto LAB_001053b4;
        }
        if (local_198[0xb] == 0) {
          lVar12 = mpp_time();
          *(long *)((long)arg + 0x58) = lVar12;
        }
        if (local_1a8 != pvVar3) {
          _mpp_log_l(2,"mpi_dec_test","mismatch frame %p -> %p\n","dec_advanced",local_1a8,pvVar3);
        }
        if (*(FILE **)((long)arg + 0x40) != (FILE *)0x0) {
          dump_mpp_frame_to_file(local_1a8,*(FILE **)((long)arg + 0x40));
        }
        pFVar7 = local_148;
        if (*(long *)((long)arg + 0x80) != 0) {
          calc_frm_crc(local_1a8,local_148);
          write_frm_crc(*(FILE **)((long)arg + 0x80),pFVar7);
        }
        if ((int)lVar5 == 0) {
          _mpp_log_l(4,"mpi_dec_test","%p decoded frame %d\n",0,lVar2,
                     (int)*(long *)((long)arg + 0x48));
        }
        *(int *)((long)arg + 0x48) = (int)*(long *)((long)arg + 0x48) + 1;
        iVar19 = mpp_frame_get_eos(local_1a8);
        if (((int)lVar5 == 0) && (iVar19 != 0)) {
          _mpp_log_l(4,"mpi_dec_test","%p found eos frame\n",0,lVar2);
        }
        fps_calc_inc(*(FpsCalc *)(lVar15 + 0x248));
        lVar15 = mpp_frame_get_meta(pvVar3);
        if (lVar15 == 0) {
LAB_0010538d:
          iVar19 = *(int *)((long)arg + 0x4c);
          if (iVar19 < 1) {
            if ((iVar19 == 0) && (local_180->eos != 0)) goto LAB_001053c8;
            goto LAB_001053d0;
          }
          if ((int)*(long *)((long)arg + 0x48) < iVar19) goto LAB_001053d0;
          goto LAB_001053c8;
        }
        iVar19 = mpp_meta_get_packet(lVar15,0x69706b74,&local_190);
        if (iVar19 == 0 && local_190 != (FileBufSlot *)0x0) {
          if (local_190 != local_138[0]) {
            _mpp_log_l(2,"mpi_dec_test","mismatch packet %p -> %p\n","dec_advanced");
          }
          goto LAB_0010538d;
        }
        _mpp_log_l(2,"mpi_dec_test","%p mpp meta get packet failed ret %d\n",0,lVar2,iVar19);
      }
      else {
        pcVar17 = "%p mpp decode put packet failed ret %d\n";
LAB_001053b4:
        _mpp_log_l(2,"mpi_dec_test",pcVar17,0,lVar2,iVar19);
        arg = local_198;
LAB_001053c8:
        *(undefined4 *)((long)arg + 0x1c) = 1;
      }
LAB_001053d0:
      mpp_packet_deinit(local_138);
      uVar22 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      iVar19 = *(int *)((long)arg + 0x1c);
    }
  }
  else if (*(int *)((long)arg + 0x1c) == 0) {
LAB_00104872:
    local_168 = *arg;
    lVar15 = *(long *)((long)arg + 8);
    lVar2 = *(long *)((long)arg + 0x10);
    local_160 = *(long *)((long)arg + 0x30);
    local_190 = (FileBufSlot *)0x0;
    local_184 = *(uint *)((long)arg + 0x18);
    uVar14 = (ulong)local_184;
    MVar8 = reader_read(*(FileReader *)(local_168 + 0x240),&local_190);
    if (MVar8 != MPP_OK) {
      in_stack_fffffffffffffe38 =
           (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),0x4e);
      uVar14 = 0;
      _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"ret == MPP_OK","dec_simple",
                 in_stack_fffffffffffffe38);
      if ((DAT_001142fb & 0x10) != 0) {
LAB_00105420:
        abort();
      }
    }
    if (local_190 == (FileBufSlot *)0x0) {
      in_stack_fffffffffffffe38 =
           (MppFrame)CONCAT44((int)((ulong)in_stack_fffffffffffffe38 >> 0x20),0x4f);
      uVar14 = 0;
      _mpp_log_l(2,"mpi_dec_test","Assertion %s failed at %s:%d\n",0,"slot","dec_simple",
                 in_stack_fffffffffffffe38);
      if ((DAT_001142fb & 0x10) != 0) goto LAB_00105420;
    }
    uVar14 = CONCAT71((int7)(uVar14 >> 8),1);
    local_174 = (undefined4)uVar14;
    if (local_190->eos != 0) {
      if ((*(int *)((long)arg + 0x4c) < 0) ||
         ((int)*(long *)((long)arg + 0x48) < *(int *)((long)arg + 0x4c))) {
        if (local_184 == 0) {
          uVar14 = 0;
          _mpp_log_l(4,"mpi_dec_test","%p loop again\n",0,lVar15);
        }
        reader_rewind(*(FileReader *)(local_168 + 0x240));
      }
      else {
        if (local_184 == 0) {
          uVar14 = 0;
          _mpp_log_l(4,"mpi_dec_test","%p found last packet\n",0,lVar15);
        }
        *(undefined4 *)((long)arg + 0x1c) = 1;
        local_174 = 0;
      }
    }
    lVar12 = local_160;
    mpp_packet_set_data(local_160,local_190->data);
    mpp_packet_set_size(lVar12,local_190->size);
    mpp_packet_set_pos(lVar12,local_190->data);
    mpp_packet_set_length(lVar12,local_190->size);
    if ((char)local_174 == '\0') {
      mpp_packet_set_eos(local_160);
    }
    iVar19 = 0;
    do {
      iVar18 = 0;
      if (iVar19 == 0) {
        iVar19 = (**(code **)(lVar2 + 0x10))(lVar15,local_160);
        uVar1 = (uint)CONCAT71((int7)(uVar14 >> 8),1);
        if (iVar19 == 0) {
          if (*(long *)((long)arg + 0x50) == 0) {
            lVar12 = mpp_time();
            *(long *)((long)arg + 0x50) = lVar12;
          }
          goto LAB_00104a1e;
        }
      }
      else {
LAB_00104a1e:
        iVar18 = 1;
        uVar1 = 0;
      }
      local_170 = uVar1;
      local_199 = (byte)local_174 | (byte)local_170;
      iVar19 = 0x1e;
      local_16c = iVar18;
LAB_00104a52:
      do {
        local_1a8 = (MppFrame)0x0;
        while (iVar18 = (**(code **)(lVar2 + 0x18))(lVar15,&local_1a8), iVar18 == -8) {
          if (iVar19 < 1) {
            _mpp_log_l(2,"mpi_dec_test","%p decode_get_frame failed too much time\n",0,lVar15);
            goto LAB_00104de8;
          }
          iVar19 = iVar19 + -1;
          usleep(1000);
        }
        if (iVar18 != 0) {
LAB_00104de8:
          bVar20 = false;
          _mpp_log_l(2,"mpi_dec_test","%p decode_get_frame failed ret %d\n",0,iVar18,lVar15);
          arg = local_198;
          goto LAB_00104e0d;
        }
        local_140 = local_1a8;
        if (local_1a8 != (MppFrame)0x0) {
          iVar18 = mpp_frame_get_info_change();
          if (iVar18 == 0) {
            local_188 = mpp_frame_get_errinfo(local_1a8);
            local_178 = mpp_frame_get_discard(local_1a8);
            plVar6 = local_198;
            if (local_198[0xb] == 0) {
              lVar12 = mpp_time();
              plVar6[0xb] = lVar12;
            }
            iVar18 = snprintf((char *)local_138,0xff,"decode get frame %d",
                              (ulong)*(uint *)(plVar6 + 9));
            iVar9 = mpp_frame_has_meta(local_1a8);
            if (iVar9 != 0) {
              uVar13 = mpp_frame_get_meta(local_1a8);
              local_180 = (FileBufSlot *)((ulong)local_180 & 0xffffffff00000000);
              mpp_meta_get_s32(uVar13,0x746c6964,&local_180);
              iVar9 = snprintf((char *)((long)local_138 + (long)iVar18),(long)(0xff - iVar18),
                               " tid %d",(ulong)local_180 & 0xffffffff);
              iVar18 = iVar18 + iVar9;
            }
            if (local_188 != 0 || local_178 != 0) {
              snprintf((char *)((long)local_138 + (long)iVar18),(long)(0xff - iVar18),
                       " err %x discard %x",(ulong)local_188);
            }
            if (local_184 == 0) {
              _mpp_log_l(4,"mpi_dec_test","%p %s\n",0,lVar15,local_138);
            }
            plVar6 = local_198;
            *(int *)(local_198 + 9) = (int)local_198[9] + 1;
            if ((FILE *)local_198[8] != (FILE *)0x0 && local_188 == 0) {
              dump_mpp_frame_to_file(local_1a8,(FILE *)local_198[8]);
            }
            pFVar7 = local_148;
            if (plVar6[0x10] != 0) {
              calc_frm_crc(local_1a8,local_148);
              write_frm_crc((FILE *)plVar6[0x10],pFVar7);
            }
            fps_calc_inc(*(FpsCalc *)(local_168 + 0x248));
LAB_00104d35:
            iVar18 = mpp_frame_get_eos(local_1a8);
            mpp_frame_deinit(&local_1a8);
            bVar20 = iVar18 != 0;
            goto LAB_00104d51;
          }
          local_188 = mpp_frame_get_width(local_1a8);
          local_178 = mpp_frame_get_height(local_1a8);
          local_154 = mpp_frame_get_hor_stride(local_1a8);
          local_158 = mpp_frame_get_ver_stride(local_1a8);
          size = mpp_frame_get_buf_size(local_1a8);
          uVar22 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
          if (local_184 == 0) {
            _mpp_log_l(4,"mpi_dec_test","%p decode_get_frame get info changed found\n",0,lVar15);
            in_stack_fffffffffffffe38 = (MppFrame)CONCAT44(uVar22,local_178);
            _mpp_log_l(4,"mpi_dec_test",
                       "%p decoder require buffer w:h [%d:%d] stride [%d:%d] buf_size %d",0,lVar15,
                       local_188,in_stack_fffffffffffffe38,local_154,local_158,size);
          }
          arg = local_198;
          pvVar11 = dec_buf_mgr_setup((DecBufMgr)local_198[4],size,0x18,
                                      *(MppDecBufMode *)(local_168 + 0x230));
          iVar18 = (**(code **)(lVar2 + 0x70))(lVar15,0x310002,pvVar11);
          if (iVar18 == 0) {
            *(MppBufferGroup *)((long)arg + 0x28) = pvVar11;
            iVar18 = (**(code **)(lVar2 + 0x70))(lVar15,0x310003,0);
            if (iVar18 == 0) goto LAB_00104d35;
            bVar20 = false;
            _mpp_log_l(2,"mpi_dec_test","%p info change ready failed ret %d\n",0,lVar15,iVar18);
          }
          else {
            bVar20 = false;
            _mpp_log_l(2,"mpi_dec_test","%p set buffer group failed ret %d\n",0,lVar15,iVar18);
          }
          goto LAB_00104e0d;
        }
        bVar20 = false;
LAB_00104d51:
        plVar6 = local_198;
        if ((local_198[5] != 0) && (uVar14 = mpp_buffer_group_usage(), (ulong)plVar6[0xc] < uVar14))
        {
          plVar6[0xc] = uVar14;
        }
        arg = local_198;
        if ((local_199 & 1) == 0 && !bVar20) {
          usleep(1000);
          goto LAB_00104a52;
        }
        if (bVar20) {
          bVar20 = true;
          if (local_184 == 0) {
            _mpp_log_l(4,"mpi_dec_test","%p found last packet\n",0,lVar15);
          }
LAB_00104e0d:
          iVar18 = *(int *)((long)arg + 0x4c);
          goto LAB_00104e11;
        }
        iVar18 = *(int *)((long)local_198 + 0x4c);
        if ((0 < iVar18) && (iVar18 <= (int)local_198[9])) {
          bVar20 = false;
          goto LAB_00104e0d;
        }
      } while (local_140 != (MppFrame)0x0);
      bVar20 = false;
LAB_00104e11:
      iVar19 = local_16c;
      uVar22 = (undefined4)((ulong)in_stack_fffffffffffffe38 >> 0x20);
      uVar14 = (ulong)local_170;
      if (iVar18 < 1) {
        if (bVar20 && iVar18 == 0) goto LAB_00104f9e;
      }
      else if (iVar18 <= (int)*(long *)((long)arg + 0x48)) {
LAB_00104f9e:
        *(undefined4 *)((long)arg + 0x1c) = 1;
        break;
      }
      if ((char)local_170 == '\0') goto LAB_00104f0c;
      usleep(1000);
    } while( true );
  }
LAB_00104fbd:
  lVar15 = mpp_time();
  lVar15 = lVar15 - local_150;
  *(long *)((long)arg + 0x70) = lVar15;
  fVar21 = ((float)(int)*(long *)((long)arg + 0x48) * 1e+06) / (float)lVar15;
  *(float *)((long)arg + 0x68) = fVar21;
  *(long *)((long)arg + 0x78) = *(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x50);
  auVar4 = SEXT816(*(long *)((long)arg + 0x58) - *(long *)((long)arg + 0x50)) *
           SEXT816(0x20c49ba5e353f7cf);
  _mpp_log_l(SUB84((double)fVar21,0),4,"mpi_dec_test",
             "decode %d frames time %lld ms delay %3d ms fps %3.2f\n",0,
             (int)*(long *)((long)arg + 0x48),lVar15 / 1000,
             CONCAT44(uVar22,(int)(auVar4._8_8_ >> 7) - (auVar4._12_4_ >> 0x1f)));
  if (*(long *)((long)arg + 0x90) != 0) {
    mpp_osal_free("thread_decode");
  }
  *(long *)((long)arg + 0x90) = 0;
  if (*(long *)((long)arg + 0xa8) != 0) {
    mpp_osal_free("thread_decode");
  }
  *(long *)((long)arg + 0xa8) = 0;
  return (void *)0x0;
LAB_00104f0c:
  if (*(int *)((long)arg + 0x1c) != 0) goto LAB_00104fbd;
  goto LAB_00104872;
}

Assistant:

void *thread_decode(void *arg)
{
    MpiDecLoopData *data = (MpiDecLoopData *)arg;
    MpiDecTestCmd *cmd = data->cmd;
    MppCtx ctx  = data->ctx;
    MppApi *mpi = data->mpi;
    RK_S64 t_s, t_e;

    memset(&data->checkcrc, 0, sizeof(data->checkcrc));
    data->checkcrc.luma.sum = mpp_malloc(RK_ULONG, 512);
    data->checkcrc.chroma.sum = mpp_malloc(RK_ULONG, 512);

    t_s = mpp_time();

    if (cmd->simple) {
        while (!data->loop_end)
            dec_simple(data);
    } else {
        /* NOTE: change output format before jpeg decoding */
        if (MPP_FRAME_FMT_IS_YUV(cmd->format) || MPP_FRAME_FMT_IS_RGB(cmd->format)) {
            MPP_RET ret = mpi->control(ctx, MPP_DEC_SET_OUTPUT_FORMAT, &cmd->format);
            if (ret) {
                mpp_err("Failed to set output format 0x%x\n", cmd->format);
                return NULL;
            }
        }

        while (!data->loop_end)
            dec_advanced(data);
    }

    t_e = mpp_time();
    data->elapsed_time = t_e - t_s;
    data->frame_count = data->frame_count;
    data->frame_rate = (float)data->frame_count * 1000000 / data->elapsed_time;
    data->delay = data->first_frm - data->first_pkt;

    mpp_log("decode %d frames time %lld ms delay %3d ms fps %3.2f\n",
            data->frame_count, (RK_S64)(data->elapsed_time / 1000),
            (RK_S32)(data->delay / 1000), data->frame_rate);

    MPP_FREE(data->checkcrc.luma.sum);
    MPP_FREE(data->checkcrc.chroma.sum);

    return NULL;
}